

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O3

int __thiscall
ExtraData::getVectorHeader(ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val)

{
  uint uVar1;
  ostream *poVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_28,val);
  uVar1 = Utils::lenFourBytes(&local_28);
  if (local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"              VectorHeader:         ",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 Length:            ",0x24);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes. ",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return uVar1;
}

Assistant:

int ExtraData::getVectorHeader(std::vector<unsigned int> val) {
    int len = Utils::lenFourBytes(val);
    cout << "              VectorHeader:         " << endl;
    cout << "                 Length:            " << dec << len << " bytes. " << endl;
    return len;
}